

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeInternalJacobianPreInt
          (ChElementShellANCF_3833 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  PointerType pdVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char *__function;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  undefined8 *puVar15;
  Matrix<double,__1,__1,_0,__1,__1> **ppMVar16;
  long lVar17;
  Index outer_2;
  long lVar18;
  Index outer;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 in_XMM1_Qb;
  Matrix<double,__1,__1,_0,__1,__1> PI2;
  Matrix<double,__1,__1,_0,__1,__1> K2;
  ChMatrixNM<double,_1,_NSF>_conflict2 tempRow2;
  ChMatrixNM<double,_1,_NSF>_conflict2 tempRow1;
  ChMatrixNM<double,_1,_NSF>_conflict2 tempRow0;
  Matrix3xN e_bar;
  MatrixNxN K_K13Compact;
  Matrix3xN e_bar_dot;
  assign_op<double,_double> local_19e9;
  long local_19e8;
  DenseStorage<double,__1,__1,__1,_0> local_19e0;
  double *local_19c0;
  undefined8 uStack_19b8;
  long local_19b0;
  long local_19a8;
  long local_19a0;
  long local_1998;
  ChElementShellANCF_3833 *local_1990;
  long local_1988;
  double local_1980;
  undefined8 uStack_1978;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_1970;
  undefined1 local_1940 [64];
  undefined1 local_1900 [64];
  undefined1 local_18c0 [64];
  undefined1 local_1880 [64];
  undefined1 local_1840 [64];
  undefined1 local_1800 [64];
  undefined1 local_17c0 [64];
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined1 local_1700 [128];
  undefined1 local_1680 [64];
  undefined1 local_1640 [64];
  undefined1 local_1600 [64];
  undefined1 local_15c0 [64];
  undefined1 local_1580 [64];
  undefined1 local_1540 [64];
  undefined1 local_1500 [64];
  DenseStorage<double,__1,__1,__1,_0> *local_14c0 [2];
  Matrix<double,__1,__1,_0,__1,__1> *local_14b0 [574];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  local_19c0 = (double *)Rfactor;
  uStack_19b8 = in_XMM1_Qb;
  local_1980 = Kfactor;
  uStack_1978 = in_XMM0_Qb;
  CalcCoordMatrix(this,(Matrix3xN *)local_1700);
  CalcCoordDerivMatrix(this,(Matrix3xN *)local_2c0);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = this->m_Alpha;
  auVar21._8_8_ = uStack_19b8;
  auVar21._0_8_ = local_19c0;
  auVar8._8_8_ = uStack_1978;
  auVar8._0_8_ = local_1980;
  auVar21 = vfmadd213sd_fma(auVar21,auVar26,auVar8);
  auVar22 = vbroadcastsd_avx512f(auVar21);
  auVar23 = vmulpd_avx512f(auVar22,local_1700._0_64_);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = this->m_Alpha * local_1980;
  auVar24 = vbroadcastsd_avx512f(auVar27);
  auVar25 = vmulpd_avx512f(auVar24,local_2c0);
  local_17c0 = vaddpd_avx512f(auVar23,auVar25);
  auVar23 = vmulpd_avx512f(auVar22,local_1700._64_64_);
  auVar25 = vmulpd_avx512f(auVar24,local_280);
  local_1780 = vaddpd_avx512f(auVar23,auVar25);
  auVar23 = vmulpd_avx512f(auVar22,local_1680);
  auVar25 = vmulpd_avx512f(auVar24,local_240);
  local_1740 = vaddpd_avx512f(auVar23,auVar25);
  auVar23 = vmulpd_avx512f(auVar22,local_1640);
  auVar25 = vmulpd_avx512f(auVar24,local_200);
  local_1880 = vaddpd_avx512f(auVar23,auVar25);
  auVar23 = vmulpd_avx512f(auVar22,local_1600);
  auVar25 = vmulpd_avx512f(auVar24,local_1c0);
  local_1840 = vaddpd_avx512f(auVar23,auVar25);
  auVar23 = vmulpd_avx512f(auVar22,local_15c0);
  auVar25 = vmulpd_avx512f(auVar24,local_180);
  local_1800 = vaddpd_avx512f(auVar23,auVar25);
  auVar23 = vmulpd_avx512f(auVar22,local_1580);
  auVar25 = vmulpd_avx512f(auVar24,local_140);
  local_1940 = vaddpd_avx512f(auVar23,auVar25);
  auVar23 = vmulpd_avx512f(auVar22,local_1540);
  auVar25 = vmulpd_avx512f(auVar24,local_100);
  local_1900 = vaddpd_avx512f(auVar23,auVar25);
  auVar22 = vmulpd_avx512f(auVar22,local_1500);
  auVar23 = vmulpd_avx512f(auVar24,local_c0);
  local_18c0 = vaddpd_avx512f(auVar22,auVar23);
  local_19e0.m_data = (double *)0x0;
  local_19e0.m_rows = 0;
  local_19e0.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_19e0,0x1440,9,0x240);
  lVar11 = 0;
  lVar12 = 0;
  do {
    if ((local_19e0.m_rows < 3) || (lVar14 = lVar12 * 0x18 + 0x18, local_19e0.m_cols < lVar14)) {
LAB_00775dbe:
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, -1>, 3, 24>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 3, BlockCols = 24, InnerPanel = false]"
      ;
      goto LAB_00775db4;
    }
    dVar1 = *(double *)(local_1700 + lVar12 * 8);
    dVar2 = *(double *)(local_1640 + lVar12 * 8);
    dVar3 = *(double *)(local_1580 + lVar12 * 8);
    lVar19 = 0;
    ppMVar16 = local_14b0;
    do {
      dVar4 = *(double *)(local_17c0 + lVar19 * 8);
      ppMVar16[-2] = (Matrix<double,__1,__1,_0,__1,__1> *)(dVar1 * dVar4);
      ppMVar16[-1] = (Matrix<double,__1,__1,_0,__1,__1> *)(dVar2 * dVar4);
      *ppMVar16 = (Matrix<double,__1,__1,_0,__1,__1> *)(dVar3 * dVar4);
      lVar19 = lVar19 + 1;
      ppMVar16 = ppMVar16 + 3;
    } while (lVar19 != 0x18);
    puVar15 = (undefined8 *)((long)local_19e0.m_data + local_19e0.m_rows * lVar11 + 0x10);
    lVar19 = 0x10;
    do {
      uVar7 = *(undefined8 *)(local_1500 + lVar19 + 0x38);
      puVar15[-2] = *(undefined8 *)(local_1500 + lVar19 + 0x30);
      puVar15[-1] = uVar7;
      *puVar15 = *(undefined8 *)((long)local_14c0 + lVar19);
      lVar19 = lVar19 + 0x18;
      puVar15 = puVar15 + local_19e0.m_rows;
    } while (lVar19 != 0x250);
    if ((local_19e0.m_rows < 6) || (local_19e0.m_cols < lVar14)) goto LAB_00775dbe;
    dVar1 = *(double *)(local_1700 + lVar12 * 8);
    dVar2 = *(double *)(local_1640 + lVar12 * 8);
    dVar3 = *(double *)(local_1580 + lVar12 * 8);
    lVar19 = 0;
    ppMVar16 = local_14b0;
    do {
      dVar4 = *(double *)(local_1880 + lVar19 * 8);
      ppMVar16[-2] = (Matrix<double,__1,__1,_0,__1,__1> *)(dVar1 * dVar4);
      ppMVar16[-1] = (Matrix<double,__1,__1,_0,__1,__1> *)(dVar2 * dVar4);
      *ppMVar16 = (Matrix<double,__1,__1,_0,__1,__1> *)(dVar3 * dVar4);
      lVar19 = lVar19 + 1;
      ppMVar16 = ppMVar16 + 3;
    } while (lVar19 != 0x18);
    puVar15 = (undefined8 *)((long)local_19e0.m_data + local_19e0.m_rows * lVar11 + 0x28);
    lVar19 = 0x10;
    do {
      uVar7 = *(undefined8 *)(local_1500 + lVar19 + 0x38);
      puVar15[-2] = *(undefined8 *)(local_1500 + lVar19 + 0x30);
      puVar15[-1] = uVar7;
      *puVar15 = *(undefined8 *)((long)local_14c0 + lVar19);
      lVar19 = lVar19 + 0x18;
      puVar15 = puVar15 + local_19e0.m_rows;
    } while (lVar19 != 0x250);
    if ((local_19e0.m_rows < 9) || (local_19e0.m_cols < lVar14)) goto LAB_00775dbe;
    dVar1 = *(double *)(local_1700 + lVar12 * 8);
    dVar2 = *(double *)(local_1640 + lVar12 * 8);
    dVar3 = *(double *)(local_1580 + lVar12 * 8);
    lVar14 = 0;
    ppMVar16 = local_14b0;
    do {
      dVar4 = *(double *)(local_1940 + lVar14 * 8);
      ppMVar16[-2] = (Matrix<double,__1,__1,_0,__1,__1> *)(dVar1 * dVar4);
      ppMVar16[-1] = (Matrix<double,__1,__1,_0,__1,__1> *)(dVar2 * dVar4);
      *ppMVar16 = (Matrix<double,__1,__1,_0,__1,__1> *)(dVar3 * dVar4);
      lVar14 = lVar14 + 1;
      ppMVar16 = ppMVar16 + 3;
    } while (lVar14 != 0x18);
    puVar15 = (undefined8 *)((long)local_19e0.m_data + local_19e0.m_rows * lVar11 + 0x40);
    lVar14 = 0x10;
    do {
      uVar7 = *(undefined8 *)(local_1500 + lVar14 + 0x38);
      puVar15[-2] = *(undefined8 *)(local_1500 + lVar14 + 0x30);
      puVar15[-1] = uVar7;
      *puVar15 = *(undefined8 *)((long)local_14c0 + lVar14);
      lVar14 = lVar14 + 0x18;
      puVar15 = puVar15 + local_19e0.m_rows;
    } while (lVar14 != 0x250);
    lVar12 = lVar12 + 1;
    lVar11 = lVar11 + 0xc0;
  } while (lVar12 != 0x18);
  local_14b0[0] = &this->m_O2;
  local_14c0[0] = &local_19e0;
  if (local_19e0.m_cols !=
      (this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
     ) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                 );
  }
  local_1990 = this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_19a8,
             (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)local_14c0);
  local_19c0 = (double *)(local_19a8 + 0x40);
  local_1988 = local_19a0 * 8;
  local_19e8 = 8;
  local_19b0 = 0x10;
  lVar12 = 0;
  lVar11 = 0;
  while (2 < local_19a0) {
    pdVar5 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
    lVar14 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value;
    lVar19 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).m_stride.m_outer.m_value;
    lVar20 = lVar19 * lVar12;
    lVar18 = lVar19 * local_19e8;
    lVar19 = lVar19 * local_19b0;
    lVar10 = 2;
    pdVar13 = local_19c0;
    lVar17 = lVar11;
    do {
      if (local_1998 <= lVar17) goto LAB_00775d69;
      if ((lVar14 < lVar11 * 3 + 3) ||
         ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar10 + -2)) {
LAB_00775d9f:
        __function = 
        "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00775db4;
      }
      *(double *)((long)pdVar5 + lVar10 * 8 + lVar20 + -0x10) = pdVar13[-8];
      *(double *)((long)pdVar5 + lVar10 * 8 + lVar18 + -0x10) = pdVar13[-7];
      *(double *)((long)pdVar5 + lVar10 * 8 + lVar19 + -0x10) = pdVar13[-6];
      if ((local_19a0 < 6) || (local_1998 <= lVar17)) goto LAB_00775d69;
      if ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar10 + -1) goto LAB_00775d9f;
      *(double *)((long)pdVar5 + lVar10 * 8 + lVar20 + -8) = pdVar13[-5];
      *(double *)((long)pdVar5 + lVar10 * 8 + lVar18 + -8) = pdVar13[-4];
      *(double *)((long)pdVar5 + lVar10 * 8 + lVar19 + -8) = pdVar13[-3];
      if ((local_19a0 < 9) || (local_1998 <= lVar17)) goto LAB_00775d69;
      if ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar10) goto LAB_00775d9f;
      *(double *)((long)pdVar5 + lVar10 * 8 + lVar20) = pdVar13[-2];
      *(double *)((long)pdVar5 + lVar10 * 8 + lVar18) = pdVar13[-1];
      *(double *)((long)pdVar5 + lVar10 * 8 + lVar19) = *pdVar13;
      lVar10 = lVar10 + 3;
      pdVar13 = pdVar13 + local_19a0 * 0x18;
      lVar17 = lVar17 + 0x18;
    } while (lVar10 != 0x4a);
    lVar11 = lVar11 + 1;
    lVar12 = lVar12 + 0x18;
    local_19e8 = local_19e8 + 0x18;
    local_19b0 = local_19b0 + 0x18;
    local_19c0 = local_19c0 + local_19a0;
    if (lVar11 == 0x18) {
      local_1970.m_lhs.m_rows.m_value =
           (local_1990->m_K13Compact).
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      local_1970.m_lhs.m_cols.m_value =
           (local_1990->m_K13Compact).
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      if ((local_1970.m_lhs.m_cols.m_value | local_1970.m_lhs.m_rows.m_value) < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                     );
      }
      local_1970.m_rhs = &local_1990->m_K13Compact;
      auVar9._8_8_ = uStack_1978;
      auVar9._0_8_ = local_1980;
      auVar6._8_8_ = 0x8000000000000000;
      auVar6._0_8_ = 0x8000000000000000;
      auVar21 = vxorpd_avx512vl(auVar9,auVar6);
      local_1970.m_lhs.m_functor.m_other = (double)vmovlpd_avx(auVar21);
      if ((local_1970.m_lhs.m_rows.m_value != 0x18) || (local_1970.m_lhs.m_cols.m_value != 0x18)) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, 24, 24, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 24, 24, 1>]"
                     );
      }
      local_19c0 = (double *)local_14c0;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,24,24,1,24,24>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,_24,_24,_1,_24,_24> *)local_19c0,&local_1970,&local_19e9);
      lVar11 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_rows.m_value;
      local_19e8 = 0x10;
      lVar12 = 8;
      lVar14 = 0;
      lVar19 = 0;
      while (lVar19 * 3 < lVar11) {
        pdVar5 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_data;
        lVar17 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value;
        lVar10 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        lVar18 = 2;
        pdVar13 = local_19c0;
        do {
          if ((((lVar17 <= lVar18 + -2) ||
               (*(double *)((long)pdVar5 + lVar18 * 8 + lVar10 * lVar14 + -0x10) =
                     *pdVar13 + *(double *)((long)pdVar5 + lVar18 * 8 + lVar10 * lVar14 + -0x10),
               lVar11 <= lVar19 * 3 + 1)) || (lVar17 <= lVar18 + -1)) ||
             ((*(double *)((long)pdVar5 + lVar18 * 8 + lVar10 * lVar12 + -8) =
                    *pdVar13 + *(double *)((long)pdVar5 + lVar18 * 8 + lVar10 * lVar12 + -8),
              lVar11 <= lVar19 * 3 + 2 || (lVar17 <= lVar18)))) goto LAB_00775d80;
          *(double *)((long)pdVar5 + lVar18 * 8 + lVar10 * local_19e8) =
               *pdVar13 + *(double *)((long)pdVar5 + lVar18 * 8 + lVar10 * local_19e8);
          lVar18 = lVar18 + 3;
          pdVar13 = pdVar13 + 1;
        } while (lVar18 != 0x4a);
        lVar19 = lVar19 + 1;
        local_19e8 = local_19e8 + 0x18;
        lVar12 = lVar12 + 0x18;
        lVar14 = lVar14 + 0x18;
        local_19c0 = local_19c0 + 0x18;
        if (lVar19 == 0x18) {
          if (local_19a8 != 0) {
            free(*(void **)(local_19a8 + -8));
          }
          if (local_19e0.m_data != (double *)0x0) {
            free((void *)local_19e0.m_data[-1]);
          }
          return;
        }
      }
LAB_00775d80:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                   );
    }
  }
LAB_00775d69:
  __function = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
  ;
LAB_00775db4:
  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
}

Assistant:

void ChElementShellANCF_3833::ComputeInternalJacobianPreInt(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  This makes this method well suited for applications
    // with many discrete layers since the in-simulation calculations are independent of the number of Gauss quadrature
    // points used throughout the entire element.  Since computationally expensive quantities are required for both the
    // generalized internal force vector and its Jacobian, these values were cached for reuse during this Jacobian
    // calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::ColMajor> PI2;
    PI2.resize(9, NSF * NSF);

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::ColMajor> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            H(3 * i, 3 * j) += K_K13Compact(i, j);
            H(3 * i + 1, 3 * j + 1) += K_K13Compact(i, j);
            H(3 * i + 2, 3 * j + 2) += K_K13Compact(i, j);
        }
    }
}